

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

XMLUri * __thiscall xercesc_4_0::XMLUri::operator=(XMLUri *this,XMLUri *toAssign)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_30 [8];
  CleanupType_conflict5 cleanup;
  XMLUri *toAssign_local;
  XMLUri *this_local;
  
  cleanup._16_8_ = toAssign;
  cleanUp(this);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30,this,(MFPT)cleanUp);
  initialize(this,(XMLUri *)cleanup._16_8_);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30);
  return this;
}

Assistant:

XMLUri& XMLUri::operator=(const XMLUri& toAssign)
{
    cleanUp();

    CleanupType cleanup(this, &XMLUri::cleanUp);

    try {
        initialize(toAssign);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();

    return *this;
}